

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::EnumValueDescriptorProto::ByteSizeLong(EnumValueDescriptorProto *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 7) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar5 = EnumValueOptions::ByteSizeLong(this->options_);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if (this->number_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = this->number_ | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t EnumValueDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.EnumValueOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional int32 number = 2;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}